

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeStructCmpxchg<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  Result<wasm::MemoryOrder> *pRVar1;
  undefined1 local_130 [8];
  Result<wasm::MemoryOrder> order1;
  string local_e8 [32];
  undefined1 local_c8 [8];
  Result<wasm::Ok> _val_3;
  Result<wasm::MemoryOrder> order2;
  Result<wasm::Ok> field;
  Result<wasm::Ok> type;
  
  memorder<wasm::WATParser::ParseDeclsCtx>((Result<wasm::MemoryOrder> *)local_130,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)local_130);
  if (order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
      super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               (string *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    pRVar1 = (Result<wasm::MemoryOrder> *)&field;
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
                      ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    memorder<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::MemoryOrder> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)
               ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    if (type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
                 (string *)
                 ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
                        ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      goto LAB_00c1c17a;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
                      ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    if (local_130._0_4_ ==
        _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_4_) {
      typeidx<wasm::WATParser::ParseDeclsCtx>
                ((Result<wasm::Ok> *)
                 ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
                 (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      if (field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)local_c8,
                   (string *)
                   ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_c8);
        std::__cxx11::string::~string((string *)local_c8);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
        fieldidx<wasm::WATParser::ParseDeclsCtx>
                  ((__index_type *)
                   ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_c8,
                   (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
        if (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string(local_e8,(string *)local_c8);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_e8);
          std::__cxx11::string::~string(local_e8);
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_c8);
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_c8);
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
        }
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      goto LAB_00c1c17a;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               ((long)&order1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
               "struct.atomic.rmw memory orders must be identical",
               (allocator<char> *)
               ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
    Lexer::err((Err *)((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in,
               (ulong)pos,
               (string *)
               ((long)&order1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    pRVar1 = &order1;
  }
  std::__cxx11::string::~string
            ((string *)
             ((long)&(pRVar1->val).super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
LAB_00c1c17a:
  std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)local_130);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStructCmpxchg(Ctx& ctx,
                           Index pos,
                           const std::vector<Annotation>& annotations) {
  auto order1 = memorder(ctx);
  CHECK_ERR(order1);
  auto order2 = memorder(ctx);
  CHECK_ERR(order2);
  if (*order1 != *order2) {
    return ctx.in.err(pos, "struct.atomic.rmw memory orders must be identical");
  }
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructCmpxchg(pos, annotations, *type, *field, *order1);
}